

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiColumnsFlags flags)

{
  ImVector<unsigned_int> *pIVar1;
  ImGuiColumnsSet *pIVar2;
  ImVector<ImGuiColumnData> *pIVar3;
  float *pfVar4;
  int *piVar5;
  ImRect *pIVar6;
  ImVec2 IVar7;
  int iVar8;
  ImGuiWindow *this;
  ImGuiColumnData *pIVar9;
  ImGuiContext *pIVar10;
  ulong uVar11;
  int iVar12;
  ImGuiID IVar13;
  ulong uVar14;
  ImGuiColumnsSet *pIVar15;
  ImGuiColumnData *pIVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  ImGuiColumnsSet *unaff_R12;
  ImGuiColumnsSet *pIVar23;
  ImGuiContext *g;
  char *str;
  bool bVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  ImGuiColumnsSet local_70;
  
  pIVar10 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  iVar12 = columns_count + 0x11223347;
  if (str_id != (char *)0x0) {
    iVar12 = 0x11223347;
  }
  str = "columns";
  if (str_id != (char *)0x0) {
    str = str_id;
  }
  PushID(iVar12);
  IVar13 = ImGuiWindow::GetID(this,str,(char *)0x0);
  pIVar1 = &GImGui->CurrentWindow->IDStack;
  pIVar1->Size = pIVar1->Size + -1;
  uVar14 = (ulong)(this->ColumnsStorage).Size;
  bVar24 = 0 < (long)uVar14;
  if (0 < (long)uVar14) {
    unaff_R12 = (this->ColumnsStorage).Data;
    bVar24 = true;
    if (unaff_R12->ID != IVar13) {
      pIVar15 = unaff_R12 + (uVar14 - 1);
      uVar11 = 1;
      pIVar23 = unaff_R12;
      do {
        uVar22 = uVar11;
        unaff_R12 = pIVar15;
        if (uVar14 == uVar22) break;
        unaff_R12 = pIVar23 + 1;
        pIVar2 = pIVar23 + 1;
        uVar11 = uVar22 + 1;
        pIVar23 = unaff_R12;
      } while (pIVar2->ID != IVar13);
      bVar24 = uVar22 < uVar14;
    }
  }
  if (!bVar24) {
    ImGuiColumnsSet::ImGuiColumnsSet(&local_70);
    iVar12 = (this->ColumnsStorage).Size;
    iVar21 = (this->ColumnsStorage).Capacity;
    if (iVar12 == iVar21) {
      iVar12 = iVar12 + 1;
      if (iVar21 == 0) {
        iVar17 = 8;
      }
      else {
        iVar17 = iVar21 / 2 + iVar21;
      }
      if (iVar12 < iVar17) {
        iVar12 = iVar17;
      }
      if (iVar21 < iVar12) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar5 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar5 = *piVar5 + 1;
        }
        pIVar15 = (ImGuiColumnsSet *)
                  (*GImAllocatorAllocFunc)((long)iVar12 << 6,GImAllocatorUserData);
        pIVar23 = (this->ColumnsStorage).Data;
        if (pIVar23 != (ImGuiColumnsSet *)0x0) {
          memcpy(pIVar15,pIVar23,(long)(this->ColumnsStorage).Size << 6);
          pIVar23 = (this->ColumnsStorage).Data;
          if ((pIVar23 != (ImGuiColumnsSet *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar5 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar5 = *piVar5 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar23,GImAllocatorUserData);
        }
        (this->ColumnsStorage).Data = pIVar15;
        (this->ColumnsStorage).Capacity = iVar12;
      }
    }
    pIVar23 = (this->ColumnsStorage).Data;
    iVar12 = (this->ColumnsStorage).Size;
    pIVar3 = &pIVar23[iVar12].Columns;
    pIVar3->Size = local_70.Columns.Size;
    pIVar3->Capacity = local_70.Columns.Capacity;
    *(undefined4 *)&pIVar3->Data = local_70.Columns.Data._0_4_;
    *(undefined4 *)((long)&pIVar3->Data + 4) = local_70.Columns.Data._4_4_;
    pfVar4 = &pIVar23[iVar12].LineMaxY;
    *pfVar4 = local_70.LineMaxY;
    pfVar4[1] = local_70.StartPosY;
    pfVar4[2] = local_70.StartMaxPosX;
    pfVar4[3] = (float)local_70._44_4_;
    piVar5 = &pIVar23[iVar12].Count;
    *piVar5 = local_70.Count;
    piVar5[1] = (int)local_70.MinX;
    piVar5[2] = (int)local_70.MaxX;
    piVar5[3] = (int)local_70.LineMinY;
    pIVar23 = pIVar23 + iVar12;
    pIVar23->ID = local_70.ID;
    pIVar23->Flags = local_70.Flags;
    pIVar23->IsFirstFrame = local_70.IsFirstFrame;
    pIVar23->IsBeingResized = local_70.IsBeingResized;
    *(undefined2 *)&pIVar23->field_0xa = local_70._10_2_;
    pIVar23->Current = local_70.Current;
    (this->ColumnsStorage).Size = (this->ColumnsStorage).Size + 1;
    if ((void *)CONCAT44(local_70.Columns.Data._4_4_,local_70.Columns.Data._0_4_) != (void *)0x0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar5 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar5 = *piVar5 + -1;
      }
      (*GImAllocatorFreeFunc)
                ((void *)CONCAT44(local_70.Columns.Data._4_4_,local_70.Columns.Data._0_4_),
                 GImAllocatorUserData);
    }
    unaff_R12 = (this->ColumnsStorage).Data + (long)(this->ColumnsStorage).Size + -1;
    unaff_R12->ID = IVar13;
  }
  unaff_R12->Current = 0;
  unaff_R12->Count = columns_count;
  unaff_R12->Flags = flags;
  (this->DC).ColumnsSet = unaff_R12;
  fVar26 = (this->SizeContentsExplicit).x;
  if ((fVar26 == 0.0) && (!NAN(fVar26))) {
    fVar26 = (this->InnerClipRect).Max.x - (this->Pos).x;
  }
  fVar28 = (this->DC).Indent.x;
  fVar27 = fVar28 - (pIVar10->Style).ItemSpacing.x;
  unaff_R12->MinX = fVar27;
  fVar26 = fVar26 - (this->Scroll).x;
  fVar27 = fVar27 + 1.0;
  uVar25 = -(uint)(fVar27 <= fVar26);
  unaff_R12->MaxX = (float)(~uVar25 & (uint)fVar27 | (uint)fVar26 & uVar25);
  fVar26 = (this->DC).CursorPos.y;
  unaff_R12->StartPosY = fVar26;
  unaff_R12->StartMaxPosX = (this->DC).CursorMaxPos.x;
  unaff_R12->LineMaxY = fVar26;
  unaff_R12->LineMinY = fVar26;
  (this->DC).ColumnsOffset.x = 0.0;
  (this->DC).CursorPos.x = (float)(int)(fVar28 + (this->Pos).x + 0.0);
  iVar12 = (unaff_R12->Columns).Size;
  iVar21 = columns_count + 1;
  if (iVar12 != iVar21 && iVar12 != 0) {
    iVar12 = (unaff_R12->Columns).Capacity;
    if (iVar12 < 0) {
      uVar18 = iVar12 / 2 + iVar12;
      uVar25 = 0;
      if (0 < (int)uVar18) {
        uVar25 = uVar18;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar5 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar5 = *piVar5 + 1;
      }
      pIVar16 = (ImGuiColumnData *)
                (*GImAllocatorAllocFunc)((ulong)uVar25 * 0x1c,GImAllocatorUserData);
      pIVar9 = (unaff_R12->Columns).Data;
      if (pIVar9 != (ImGuiColumnData *)0x0) {
        memcpy(pIVar16,pIVar9,(long)(unaff_R12->Columns).Size * 0x1c);
        pIVar9 = (unaff_R12->Columns).Data;
        if ((pIVar9 != (ImGuiColumnData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar5 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar5 = *piVar5 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar9,GImAllocatorUserData);
      }
      (unaff_R12->Columns).Data = pIVar16;
      (unaff_R12->Columns).Capacity = uVar25;
    }
    (unaff_R12->Columns).Size = 0;
  }
  bVar24 = (unaff_R12->Columns).Size == 0;
  unaff_R12->IsFirstFrame = bVar24;
  if (bVar24) {
    if ((unaff_R12->Columns).Capacity <= columns_count) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar5 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar5 = *piVar5 + 1;
      }
      pIVar16 = (ImGuiColumnData *)
                (*GImAllocatorAllocFunc)((long)iVar21 * 0x1c,GImAllocatorUserData);
      pIVar9 = (unaff_R12->Columns).Data;
      if (pIVar9 != (ImGuiColumnData *)0x0) {
        memcpy(pIVar16,pIVar9,(long)(unaff_R12->Columns).Size * 0x1c);
        pIVar9 = (unaff_R12->Columns).Data;
        if ((pIVar9 != (ImGuiColumnData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar5 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar5 = *piVar5 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar9,GImAllocatorUserData);
      }
      (unaff_R12->Columns).Data = pIVar16;
      (unaff_R12->Columns).Capacity = iVar21;
    }
    if (-1 < columns_count) {
      iVar12 = 0;
      do {
        iVar17 = (unaff_R12->Columns).Size;
        iVar8 = (unaff_R12->Columns).Capacity;
        if (iVar17 == iVar8) {
          if (iVar8 == 0) {
            iVar19 = 8;
          }
          else {
            iVar19 = iVar8 / 2 + iVar8;
          }
          iVar17 = iVar17 + 1;
          if (iVar17 < iVar19) {
            iVar17 = iVar19;
          }
          if (iVar8 < iVar17) {
            if (GImGui != (ImGuiContext *)0x0) {
              piVar5 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar5 = *piVar5 + 1;
            }
            pIVar16 = (ImGuiColumnData *)
                      (*GImAllocatorAllocFunc)((long)iVar17 * 0x1c,GImAllocatorUserData);
            pIVar9 = (unaff_R12->Columns).Data;
            if (pIVar9 != (ImGuiColumnData *)0x0) {
              memcpy(pIVar16,pIVar9,(long)(unaff_R12->Columns).Size * 0x1c);
              pIVar9 = (unaff_R12->Columns).Data;
              if ((pIVar9 != (ImGuiColumnData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                piVar5 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar5 = *piVar5 + -1;
              }
              (*GImAllocatorFreeFunc)(pIVar9,GImAllocatorUserData);
            }
            (unaff_R12->Columns).Data = pIVar16;
            (unaff_R12->Columns).Capacity = iVar17;
          }
        }
        pIVar9 = (unaff_R12->Columns).Data;
        iVar17 = (unaff_R12->Columns).Size;
        pIVar9[iVar17].OffsetNorm = (float)iVar12 / (float)columns_count;
        pIVar9[iVar17].OffsetNormBeforeResize = 0.0;
        pIVar9[iVar17].Flags = 0;
        pIVar6 = &pIVar9[iVar17].ClipRect;
        (pIVar6->Min).x = 3.4028235e+38;
        (pIVar6->Min).y = 3.4028235e+38;
        (pIVar6->Max).x = -3.4028235e+38;
        (pIVar6->Max).y = -3.4028235e+38;
        (unaff_R12->Columns).Size = (unaff_R12->Columns).Size + 1;
        iVar12 = iVar12 + 1;
      } while (iVar21 != iVar12);
    }
  }
  if (0 < columns_count) {
    lVar20 = 0;
    do {
      pIVar9 = (unaff_R12->Columns).Data;
      fVar28 = (this->Pos).x + 0.5;
      pIVar23 = (GImGui->CurrentWindow->DC).ColumnsSet;
      pIVar16 = (pIVar23->Columns).Data;
      fVar26 = pIVar23->MinX;
      fVar27 = pIVar23->MaxX - fVar26;
      fVar31 = (float)(int)(*(float *)((long)&pIVar16->OffsetNorm + lVar20) * fVar27 + fVar26 +
                            fVar28 + -1.0);
      fVar26 = (float)(int)(fVar27 * *(float *)((long)&pIVar16[1].OffsetNorm + lVar20) + fVar26 +
                            fVar28 + -1.0);
      *(float *)((long)&(pIVar9->ClipRect).Min.x + lVar20) = fVar31;
      *(undefined4 *)((long)&(pIVar9->ClipRect).Min.y + lVar20) = 0xff7fffff;
      *(float *)((long)&(pIVar9->ClipRect).Max.x + lVar20) = fVar26;
      *(undefined4 *)((long)&(pIVar9->ClipRect).Max.y + lVar20) = 0x7f7fffff;
      IVar7 = (this->ClipRect).Min;
      fVar28 = IVar7.x;
      fVar27 = IVar7.y;
      uVar25 = -(uint)(fVar28 <= fVar31);
      uVar18 = -(uint)(fVar27 <= -3.4028235e+38);
      *(ulong *)((long)&(pIVar9->ClipRect).Min.x + lVar20) =
           CONCAT44(~uVar18 & (uint)fVar27,~uVar25 & (uint)fVar28) |
           CONCAT44(uVar18,(uint)fVar31 & uVar25) & 0xff7fffffffffffff;
      auVar29._4_4_ = 0x7f7fffff;
      auVar29._0_4_ = fVar26;
      auVar29._8_8_ = 0;
      auVar30._8_8_ = 0;
      auVar30._0_4_ = (this->ClipRect).Max.x;
      auVar30._4_4_ = (this->ClipRect).Max.y;
      auVar30 = minps(auVar29,auVar30);
      *(long *)((long)&(pIVar9->ClipRect).Max.x + lVar20) = auVar30._0_8_;
      lVar20 = lVar20 + 0x1c;
    } while ((ulong)(uint)columns_count * 0x1c != lVar20);
  }
  ImDrawList::ChannelsSplit(this->DrawList,unaff_R12->Count);
  pIVar23 = (GImGui->CurrentWindow->DC).ColumnsSet;
  iVar12 = pIVar23->Current;
  pIVar9 = (pIVar23->Columns).Data;
  PushClipRect(&pIVar9[iVar12].ClipRect.Min,&pIVar9[iVar12].ClipRect.Max,false);
  pIVar23 = (GImGui->CurrentWindow->DC).ColumnsSet;
  pIVar9 = (pIVar23->Columns).Data;
  PushItemWidth((pIVar23->MaxX - pIVar23->MinX) *
                (pIVar9[(long)pIVar23->Current + 1].OffsetNorm - pIVar9[pIVar23->Current].OffsetNorm
                ) * 0.65);
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiColumnsFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count > 1);
    IM_ASSERT(window->DC.ColumnsSet == NULL); // Nested columns are currently not supported

    // Differentiate column ID with an arbitrary prefix for cases where users name their columns set the same as another widget.
    // In addition, when an identifier isn't explicitly provided we include the number of columns in the hash to make it uniquer.
    PushID(0x11223347 + (str_id ? 0 : columns_count));
    ImGuiID id = window->GetID(str_id ? str_id : "columns");
    PopID();

    // Acquire storage for the columns set
    ImGuiColumnsSet* columns = FindOrAddColumnsSet(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.ColumnsSet = columns;

    // Set state for first column
    const float content_region_width = (window->SizeContentsExplicit.x != 0.0f) ? (window->SizeContentsExplicit.x) : (window->InnerClipRect.Max.x - window->Pos.x);
    columns->MinX = window->DC.Indent.x - g.Style.ItemSpacing.x; // Lock our horizontal range
    columns->MaxX = ImMax(content_region_width - window->Scroll.x, columns->MinX + 1.0f);
    columns->StartPosY = window->DC.CursorPos.y;
    columns->StartMaxPosX = window->DC.CursorMaxPos.x;
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize defaults
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiColumnData* column = &columns->Columns[n];
        float clip_x1 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n) - 1.0f);
        float clip_x2 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWith(window->ClipRect);
    }

    window->DrawList->ChannelsSplit(columns->Count);
    PushColumnClipRect();
    PushItemWidth(GetColumnWidth() * 0.65f);
}